

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

void Fl::add_fd(int n,int events,_func_void_int_void_ptr *cb,void *v)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FD *local_30;
  FD *temp;
  int i;
  void *v_local;
  _func_void_int_void_ptr *cb_local;
  int events_local;
  int n_local;
  
  remove_fd(n,events);
  iVar2 = nfds;
  iVar3 = nfds + 1;
  bVar1 = fd_array_size <= nfds;
  nfds = iVar3;
  if (bVar1) {
    fd_array_size = fd_array_size * 2 + 1;
    if (fd == (FD *)0x0) {
      local_30 = (FD *)malloc((long)fd_array_size * 0x18);
    }
    else {
      local_30 = (FD *)realloc(fd,(long)fd_array_size * 0x18);
    }
    if (local_30 == (FD *)0x0) {
      return;
    }
    fd = local_30;
  }
  fd[iVar2].cb = cb;
  fd[iVar2].arg = v;
  fd[iVar2].fd = n;
  fd[iVar2].events = (short)events;
  if ((events & 1U) != 0) {
    fdsets[0].fds_bits[n / 0x40] =
         1L << ((byte)((long)n % 0x40) & 0x3f) | fdsets[0].fds_bits[n / 0x40];
  }
  if ((events & 4U) != 0) {
    fdsets[1].fds_bits[n / 0x40] =
         1L << ((byte)((long)n % 0x40) & 0x3f) | fdsets[1].fds_bits[n / 0x40];
  }
  if ((events & 8U) != 0) {
    fdsets[2].fds_bits[n / 0x40] =
         1L << ((byte)((long)n % 0x40) & 0x3f) | fdsets[2].fds_bits[n / 0x40];
  }
  if (maxfd < n) {
    maxfd = n;
  }
  return;
}

Assistant:

void Fl::add_fd(int n, int events, void (*cb)(int, void*), void *v) {
  remove_fd(n,events);
  int i = nfds++;
  if (i >= fd_array_size) {
    FD *temp;
    fd_array_size = 2*fd_array_size+1;

    if (!fd) temp = (FD*)malloc(fd_array_size*sizeof(FD));
    else temp = (FD*)realloc(fd, fd_array_size*sizeof(FD));

    if (!temp) return;
    fd = temp;

#  if USE_POLL
    pollfd *tpoll;

    if (!pollfds) tpoll = (pollfd*)malloc(fd_array_size*sizeof(pollfd));
    else tpoll = (pollfd*)realloc(pollfds, fd_array_size*sizeof(pollfd));

    if (!tpoll) return;
    pollfds = tpoll;
#  endif
  }
  fd[i].cb = cb;
  fd[i].arg = v;
#  if USE_POLL
  pollfds[i].fd = n;
  pollfds[i].events = events;
#  else
  fd[i].fd = n;
  fd[i].events = events;
  if (events & POLLIN) FD_SET(n, &fdsets[0]);
  if (events & POLLOUT) FD_SET(n, &fdsets[1]);
  if (events & POLLERR) FD_SET(n, &fdsets[2]);
  if (n > maxfd) maxfd = n;
#  endif
}